

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O0

int Extra_ThreshSelectWeights5(word *t,int nVars,int *pW)

{
  int iVar1;
  int iVar2;
  int Limit;
  int nMints;
  int Lmax;
  int Lmin;
  int m;
  int *pW_local;
  int nVars_local;
  word *t_local;
  
  iVar1 = 1 << ((byte)nVars & 0x1f);
  if (nVars != 5) {
    __assert_fail("nVars == 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddThresh.c"
                  ,0xd8,"int Extra_ThreshSelectWeights5(word *, int, int *)");
  }
  pW[4] = 1;
  do {
    if (5 < pW[4]) {
      return 0;
    }
    pW[3] = pW[4];
    while (pW[3] < 6) {
      pW[2] = pW[3];
      while (pW[2] < 6) {
        pW[1] = pW[2];
        while (pW[1] < 6) {
          *pW = pW[1];
          while (*pW < 6) {
            nMints = 10000;
            Limit = 0;
            for (Lmax = 0; Lmax < iVar1; Lmax = Lmax + 1) {
              iVar2 = Abc_TtGetBit(t,Lmax);
              if (iVar2 == 0) {
                iVar2 = Extra_ThreshWeightedSum(pW,5,Lmax);
                Limit = Abc_MaxInt(Limit,iVar2);
              }
              else {
                iVar2 = Extra_ThreshWeightedSum(pW,5,Lmax);
                nMints = Abc_MinInt(nMints,iVar2);
              }
              if (nMints <= Limit) break;
            }
            if (iVar1 <= Lmax) {
              if (Limit < nMints) {
                return nMints;
              }
              __assert_fail("Lmax < Lmin",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddThresh.c"
                            ,0xec,"int Extra_ThreshSelectWeights5(word *, int, int *)");
            }
            *pW = *pW + 1;
          }
          pW[1] = pW[1] + 1;
        }
        pW[2] = pW[2] + 1;
      }
      pW[3] = pW[3] + 1;
    }
    pW[4] = pW[4] + 1;
  } while( true );
}

Assistant:

int Extra_ThreshSelectWeights5(word * t, int nVars, int * pW) {
    int m, Lmin, Lmax, nMints = (1 << nVars), Limit = nVars + 0;
    assert(nVars == 5);
    for (pW[4] = 1; pW[4] <= Limit; pW[4]++)
        for (pW[3] = pW[4]; pW[3] <= Limit; pW[3]++)
            for (pW[2] = pW[3]; pW[2] <= Limit; pW[2]++)
                for (pW[1] = pW[2]; pW[1] <= Limit; pW[1]++)
                    for (pW[0] = pW[1]; pW[0] <= Limit; pW[0]++) {
                        Lmin = 10000;
                        Lmax = 0;
                        for (m = 0; m < nMints; m++) {
                            if (Abc_TtGetBit(t, m))
                                Lmin = Abc_MinInt(Lmin,
                                        Extra_ThreshWeightedSum(pW, nVars, m));
                            else
                                Lmax = Abc_MaxInt(Lmax,
                                        Extra_ThreshWeightedSum(pW, nVars, m));
                            if (Lmax >= Lmin)
                                break;
                        }
                        if (m < nMints)
                            continue;
                        assert(Lmax < Lmin);
                        return Lmin;
                    }
    return 0;
}